

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::NameFinder::match(SelectionSet *__return_storage_ptr__,NameFinder *this,string *name)

{
  bool bVar1;
  int iVar2;
  StringTokenizer *this_00;
  string *str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  StringTokenizer tokenizer;
  allocator<char> local_d9;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  StringTokenizer local_88;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a0,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,".",(allocator<char> *)&local_b8);
  StringTokenizer::StringTokenizer(&local_88,name,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    this_00 = &local_88;
    bVar1 = StringTokenizer::hasMoreTokens(&local_88);
    if (!bVar1) break;
    StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               &local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  iVar2 = (int)((ulong)((long)local_b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (iVar2 == 3) {
    matchRigidAtoms(this,local_b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                    local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1,
                    local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2,__return_storage_ptr__);
  }
  else if (iVar2 == 2) {
    str = local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 1;
    bVar1 = isInteger((NameFinder *)this_00,str);
    if (bVar1) {
      iVar2 = lexi_cast<int>(str);
      if (iVar2 < 0) {
        snprintf(painCave.errMsg,2000,"NameFinder : Name %s.%s is an invalid name.\n",
                 ((local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                 local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
      else {
        matchInternalIndex(this,local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,iVar2,
                           __return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
      matchRigidAtoms(this,&local_d8,
                      local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_d8);
      matchStuntDouble(this,local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                       local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,__return_storage_ptr__);
    }
  }
  else if (iVar2 == 1) {
    matchMolecule(this,local_b8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
    matchStuntDouble(this,&local_d8,
                     local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
    matchBond(this,&local_d8,
              local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
    matchBend(this,&local_d8,
              local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
    matchTorsion(this,&local_d8,
                 local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"*",&local_d9);
    matchInversion(this,&local_d8,
                   local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    snprintf(painCave.errMsg,2000,"NameFinder : Invalid Name %s.\n",(name->_M_dataplus)._M_p);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  StringTokenizer::~StringTokenizer(&local_88);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet NameFinder::match(const std::string& name) {
    SelectionSet bs(nObjects_);

    StringTokenizer tokenizer(name, ".");

    std::vector<std::string> names;
    while (tokenizer.hasMoreTokens()) {
      names.push_back(tokenizer.nextToken());
    }

    int size = names.size();

    switch (size) {
    case 1:
      // could be molecule name, atom name and rigidbody name
      matchMolecule(names[0], bs);
      matchStuntDouble("*", names[0], bs);
      matchBond("*", names[0], bs);
      matchBend("*", names[0], bs);
      matchTorsion("*", names[0], bs);
      matchInversion("*", names[0], bs);

      break;
    case 2:
      // could be molecule.*(include atoms and rigidbodies) or rigidbody.*(atoms
      // belong to rigidbody)

      if (!isInteger(names[1])) {
        matchRigidAtoms("*", names[0], names[1], bs);
        matchStuntDouble(names[0], names[1], bs);
      } else {
        int internalIndex = lexi_cast<int>(names[1]);
        if (internalIndex < 0) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "NameFinder : Name %s.%s is an invalid name.\n",
                   names[0].c_str(), names[1].c_str());
          painCave.severity = OPENMD_WARNING;
          painCave.isFatal  = 0;
          simError();
        } else {
          matchInternalIndex(names[0], internalIndex, bs);
        }
      }

      break;
    case 3:
      // must be molecule.rigidbody.*
      matchRigidAtoms(names[0], names[1], names[2], bs);
      break;
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NameFinder : Invalid Name %s.\n", name.c_str());
      painCave.severity = OPENMD_WARNING;
      painCave.isFatal  = 0;
      simError();
      break;
    }
    return bs;
  }